

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

size_t pe_util::getAsciiLenW(WORD *inp,size_t maxInp,bool acceptNotTerminated)

{
  ushort uVar1;
  WORD *pWStack_30;
  WORD w;
  size_t i;
  bool acceptNotTerminated_local;
  size_t maxInp_local;
  WORD *inp_local;
  
  for (pWStack_30 = (WORD *)0x0; pWStack_30 < maxInp; pWStack_30 = (WORD *)((long)pWStack_30 + 1)) {
    uVar1 = inp[(long)pWStack_30];
    if (uVar1 == 0) {
      return (size_t)pWStack_30;
    }
    if ((((uVar1 < 0x20) || (0x7e < uVar1)) && (uVar1 != 10)) && (uVar1 != 0xd)) break;
  }
  if (acceptNotTerminated) {
    inp_local = pWStack_30;
  }
  else {
    inp_local = (WORD *)0x0;
  }
  return (size_t)inp_local;
}

Assistant:

size_t pe_util::getAsciiLenW(const WORD *inp, size_t maxInp, bool acceptNotTerminated)
{
    size_t i = 0;
    for (; i < maxInp; i++) {
        const WORD w = inp[i];
        if (w == 0) return i; //end of string
        if (!IS_PRINTABLE(w) && !IS_ENDLINE(w)) break;
    }
    if (acceptNotTerminated) return i;
    return 0;
}